

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O1

char * vrna_random_string(int l,char *symbols)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  double dVar4;
  
  sVar1 = strlen(symbols);
  pcVar2 = (char *)vrna_alloc(l + 1);
  if (0 < l) {
    uVar3 = 0;
    do {
      dVar4 = vrna_urn();
      pcVar2[uVar3] = symbols[(int)(dVar4 * (double)(int)sVar1)];
      uVar3 = uVar3 + 1;
    } while ((uint)l != uVar3);
  }
  pcVar2[l] = '\0';
  return pcVar2;
}

Assistant:

PUBLIC char *
vrna_random_string(int        l,
                   const char symbols[])
{
  char  *r;
  int   i, rn, base;

  base  = (int)strlen(symbols);
  r     = (char *)vrna_alloc(sizeof(char) * (l + 1));

  for (i = 0; i < l; i++) {
    rn    = (int)(vrna_urn() * base); /* [0, base-1] */
    r[i]  = symbols[rn];
  }
  r[l] = '\0';
  return r;
}